

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree_io.c
# Opt level: O1

ssize_t kvtree_read_attempt(char *file,int fd,void *buf,size_t size)

{
  uint uVar1;
  ssize_t sVar2;
  uint *puVar3;
  char *pcVar4;
  bool bVar5;
  ulong uVar6;
  ulong uVar7;
  int local_44;
  ulong local_38;
  
  if (size == 0) {
    uVar7 = 0;
  }
  else {
    local_44 = 10;
    uVar6 = 0;
    do {
      sVar2 = read(fd,(void *)((long)buf + uVar6),size - uVar6);
      uVar1 = (uint)sVar2;
      if ((int)uVar1 < 1) {
        bVar5 = true;
        uVar7 = uVar6;
        if (uVar1 != 0) {
          puVar3 = (uint *)__errno_location();
          uVar1 = *puVar3;
          if ((uVar1 == 4) || (uVar1 == 0xb)) {
            bVar5 = false;
            uVar7 = local_38;
          }
          else {
            pcVar4 = strerror(uVar1);
            local_44 = local_44 + -1;
            if (local_44 == 0) {
              local_44 = 0;
              kvtree_err("Giving up read on file %s errno=%d %s @ %s:%d",file,(ulong)uVar1,pcVar4,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree_io.c"
                         ,0x11f);
              local_38 = 0xffffffffffffffff;
              uVar7 = local_38;
            }
            else {
              bVar5 = false;
              kvtree_err("Error reading file %s errno=%d %s @ %s:%d",file,(ulong)uVar1,pcVar4,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree_io.c"
                         ,0x11a);
              uVar7 = local_38;
            }
          }
        }
      }
      else {
        uVar6 = uVar6 + (uVar1 & 0x7fffffff);
        bVar5 = false;
        uVar7 = local_38;
      }
      local_38 = uVar7;
      uVar7 = local_38;
    } while ((!bVar5) && (uVar7 = uVar6, uVar6 < size));
  }
  return uVar7;
}

Assistant:

ssize_t kvtree_read_attempt(const char* file, int fd, void* buf, size_t size)
{
  ssize_t n = 0;
  int retries = 10;
  while (n < size)
  {
    int rc = read(fd, (char*) buf + n, size - n);
    if (rc  > 0) {
      n += rc;
    } else if (rc == 0) {
      /* EOF */
      return n;
    } else { /* (rc < 0) */
      /* got an error, check whether it was serious */
      if (errno == EINTR || errno == EAGAIN) {
        continue;
      }

      /* something worth printing an error about */
      retries--;
      if (retries) {
        /* print an error and try again */
        kvtree_err("Error reading file %s errno=%d %s @ %s:%d",
          file, errno, strerror(errno), __FILE__, __LINE__
        );
      } else {
        /* too many failed retries, give up */
        kvtree_err("Giving up read on file %s errno=%d %s @ %s:%d",
	  file, errno, strerror(errno), __FILE__, __LINE__
        );
        return -1;
      }
    }
  }
  return n;
}